

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkDeviceMemory __thiscall VmaAllocation_T::GetMemory(VmaAllocation_T *this)

{
  if (this->m_Type == '\x02') {
    return (VkDeviceMemory)(this->field_0).m_BlockAllocation.m_AllocHandle;
  }
  if (this->m_Type == '\x01') {
    return ((this->field_0).m_BlockAllocation.m_Block)->m_hMemory;
  }
  return (VkDeviceMemory)0x0;
}

Assistant:

VkDeviceMemory VmaAllocation_T::GetMemory() const
{
    switch (m_Type)
    {
    case ALLOCATION_TYPE_BLOCK:
        return m_BlockAllocation.m_Block->GetDeviceMemory();
    case ALLOCATION_TYPE_DEDICATED:
        return m_DedicatedAllocation.m_hMemory;
    default:
        VMA_ASSERT(0);
        return VK_NULL_HANDLE;
    }
}